

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O1

int yaml_parser_scan_tag_uri
              (yaml_parser_t *parser,int directive,yaml_char_t *head,yaml_mark_t start_mark,
              yaml_char_t **uri)

{
  yaml_mark_t *pyVar1;
  size_t *psVar2;
  byte *pbVar3;
  byte bVar4;
  yaml_char_t *pyVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  bool bVar9;
  byte bVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  size_t sVar14;
  char *pcVar15;
  byte *pbVar16;
  uint uVar17;
  char *pcVar18;
  long lVar19;
  long lVar20;
  byte *local_68;
  byte *pbStack_60;
  byte *local_58 [2];
  int local_44;
  ulong local_40;
  yaml_char_t **local_38;
  
  if (head == (yaml_char_t *)0x0) {
    sVar14 = 0;
  }
  else {
    sVar14 = strlen((char *)head);
  }
  local_68 = (byte *)0x0;
  pbStack_60 = (byte *)0x0;
  local_58[0] = (byte *)0x0;
  local_68 = (byte *)yaml_malloc(0x10);
  if (local_68 != (byte *)0x0) {
    pbStack_60 = local_68 + 0x10;
    local_68[0] = 0;
    local_68[1] = 0;
    local_68[2] = 0;
    local_68[3] = 0;
    local_68[4] = 0;
    local_68[5] = 0;
    local_68[6] = 0;
    local_68[7] = 0;
    local_68[8] = 0;
    local_68[9] = 0;
    local_68[10] = 0;
    local_68[0xb] = 0;
    local_68[0xc] = 0;
    local_68[0xd] = 0;
    local_68[0xe] = 0;
    local_68[0xf] = 0;
    local_58[0] = local_68;
    do {
      if (sVar14 < (ulong)((long)pbStack_60 - (long)local_68)) {
        local_44 = directive;
        local_38 = uri;
        if (1 < sVar14) {
          memcpy(local_68,head + 1,sVar14 - 1);
          local_58[0] = local_58[0] + (sVar14 - 1);
        }
        local_40 = sVar14;
        if ((parser->unread == 0) && (iVar12 = yaml_parser_update_buffer(parser,1), iVar12 == 0))
        goto LAB_00116177;
        pcVar18 = "while parsing a %TAG directive";
        if (local_44 == 0) {
          pcVar18 = "while parsing a tag";
        }
        pyVar1 = &parser->context_mark;
        goto LAB_0011620e;
      }
      iVar12 = yaml_string_extend(&local_68,local_58,&pbStack_60);
    } while (iVar12 != 0);
  }
LAB_00116171:
  parser->error = YAML_MEMORY_ERROR;
  goto LAB_00116177;
LAB_0011620e:
  do {
    bVar11 = *(parser->buffer).pointer;
    if (((byte)(bVar11 - 0x30) < 10) || ((byte)((bVar11 & 0xdf) + 0xbf) < 0x1a)) {
      if (bVar11 != 0x25) goto LAB_00116601;
LAB_00116266:
      if ((pbStack_60 <= local_58[0] + 5) &&
         (iVar12 = yaml_string_extend(&local_68,local_58,&pbStack_60), iVar12 == 0))
      goto LAB_00116171;
      iVar12 = 0;
      do {
        if ((parser->unread < 3) && (iVar13 = yaml_parser_update_buffer(parser,3), iVar13 == 0)) {
LAB_001163c4:
          bVar9 = false;
        }
        else {
          pyVar5 = (parser->buffer).pointer;
          if (*pyVar5 != '%') {
LAB_00116318:
            parser->error = YAML_SCANNER_ERROR;
            parser->context = pcVar18;
            (parser->context_mark).column = start_mark.column;
            pyVar1->index = start_mark.index;
            (parser->context_mark).line = start_mark.line;
            pcVar15 = "did not find URI escaped octet";
LAB_001163af:
            parser->problem = pcVar15;
            (parser->problem_mark).column = (parser->mark).column;
            sVar6 = (parser->mark).line;
            (parser->problem_mark).index = (parser->mark).index;
            (parser->problem_mark).line = sVar6;
            goto LAB_001163c4;
          }
          bVar11 = pyVar5[1];
          if ((9 < (byte)(bVar11 - 0x30)) &&
             ((0x25 < bVar11 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar11 - 0x41) & 0x3f) & 1) == 0)
              ))) goto LAB_00116318;
          bVar4 = pyVar5[2];
          if ((9 < (byte)(bVar4 - 0x30)) &&
             ((0x25 < bVar4 - 0x41 || ((0x3f0000003fU >> ((ulong)(bVar4 - 0x41) & 0x3f) & 1) == 0)))
             ) goto LAB_00116318;
          if ((byte)(bVar11 + 0xbf) < 6) {
            bVar10 = bVar11 - 0x37;
          }
          else {
            bVar10 = bVar11 + 0xa9;
            if (5 < (byte)(bVar11 + 0x9f)) {
              bVar10 = bVar11 - 0x30;
            }
          }
          if ((byte)(bVar4 + 0xbf) < 6) {
            bVar11 = bVar4 - 0x37;
          }
          else {
            bVar11 = bVar4 + 0xa9;
            if (5 < (byte)(bVar4 + 0x9f)) {
              bVar11 = bVar4 - 0x30;
            }
          }
          bVar11 = bVar10 * '\x10' + bVar11;
          if (iVar12 != 0) {
            parser->error = YAML_SCANNER_ERROR;
            parser->context = pcVar18;
            (parser->context_mark).column = start_mark.column;
            pyVar1->index = start_mark.index;
            (parser->context_mark).line = start_mark.line;
            pcVar15 = "found an incorrect trailing UTF-8 octet";
            goto LAB_001163af;
          }
          iVar12 = 1;
          if ((((char)bVar11 < '\0') && (iVar12 = 2, (bVar11 & 0xe0) != 0xc0)) &&
             (iVar12 = 3, (bVar11 & 0xf0) != 0xe0)) {
            iVar12 = (uint)((bVar11 & 0xf8) == 0xf0) << 2;
          }
          if (iVar12 == 0) {
            parser->error = YAML_SCANNER_ERROR;
            parser->context = pcVar18;
            (parser->context_mark).column = start_mark.column;
            pyVar1->index = start_mark.index;
            (parser->context_mark).line = start_mark.line;
            parser->problem = "found an incorrect leading UTF-8 octet";
            (parser->problem_mark).column = (parser->mark).column;
            sVar6 = (parser->mark).line;
            (parser->problem_mark).index = (parser->mark).index;
            (parser->problem_mark).line = sVar6;
            iVar12 = 0;
            goto LAB_001163c4;
          }
          *local_58[0] = bVar11;
          sVar6 = (parser->mark).index;
          (parser->mark).index = sVar6 + 1;
          sVar7 = (parser->mark).column;
          (parser->mark).column = sVar7 + 1;
          pbVar16 = (parser->buffer).pointer;
          sVar8 = parser->unread;
          parser->unread = sVar8 - 1;
          bVar11 = *pbVar16;
          lVar19 = 1;
          lVar20 = 1;
          if ((((char)bVar11 < '\0') && (lVar20 = 2, (bVar11 & 0xe0) != 0xc0)) &&
             (lVar20 = 3, (bVar11 & 0xf0) != 0xe0)) {
            lVar20 = (ulong)((bVar11 & 0xf8) == 0xf0) << 2;
          }
          pbVar3 = pbVar16 + lVar20;
          (parser->buffer).pointer = pbVar3;
          (parser->mark).index = sVar6 + 2;
          (parser->mark).column = sVar7 + 2;
          parser->unread = sVar8 - 2;
          bVar11 = pbVar16[lVar20];
          if ((((char)bVar11 < '\0') && (lVar19 = 2, (bVar11 & 0xe0) != 0xc0)) &&
             (lVar19 = 3, (bVar11 & 0xf0) != 0xe0)) {
            lVar19 = (ulong)((bVar11 & 0xf8) == 0xf0) << 2;
          }
          (parser->buffer).pointer = pbVar3 + lVar19;
          (parser->mark).index = sVar6 + 3;
          (parser->mark).column = sVar7 + 3;
          parser->unread = sVar8 - 3;
          bVar11 = pbVar3[lVar19];
          lVar20 = 1;
          if ((((char)bVar11 < '\0') && (lVar20 = 2, (bVar11 & 0xe0) != 0xc0)) &&
             (lVar20 = 3, (bVar11 & 0xf0) != 0xe0)) {
            lVar20 = (ulong)((bVar11 & 0xf8) == 0xf0) << 2;
          }
          (parser->buffer).pointer = pbVar3 + lVar19 + lVar20;
          bVar9 = true;
          local_58[0] = local_58[0] + 1;
        }
      } while ((bVar9) && (iVar12 = iVar12 + -1, iVar12 != 0));
      if (!bVar9) break;
    }
    else {
      uVar17 = bVar11 - 0x21;
      if (uVar17 < 0x3f) {
        if ((0x54000000d6007fe9U >> ((ulong)uVar17 & 0x3f) & 1) != 0) goto LAB_00116601;
        if ((ulong)uVar17 == 4) goto LAB_00116266;
      }
      if (bVar11 != 0x7e) {
        if (local_40 != 0) {
          *local_38 = local_68;
          return 1;
        }
        if ((pbStack_60 <= local_58[0] + 5) &&
           (iVar12 = yaml_string_extend(&local_68,local_58,&pbStack_60), iVar12 == 0))
        goto LAB_00116171;
        pcVar18 = "while parsing a %TAG directive";
        if (local_44 == 0) {
          pcVar18 = "while parsing a tag";
        }
        parser->error = YAML_SCANNER_ERROR;
        parser->context = pcVar18;
        (parser->context_mark).index = start_mark.index;
        (parser->context_mark).line = start_mark.line;
        (parser->context_mark).column = start_mark.column;
        parser->problem = "did not find expected tag URI";
        sVar6 = (parser->mark).line;
        (parser->problem_mark).index = (parser->mark).index;
        (parser->problem_mark).line = sVar6;
        (parser->problem_mark).column = (parser->mark).column;
        break;
      }
LAB_00116601:
      if ((pbStack_60 <= local_58[0] + 5) &&
         (iVar12 = yaml_string_extend(&local_68,local_58,&pbStack_60), iVar12 == 0))
      goto LAB_00116171;
      pbVar16 = (parser->buffer).pointer;
      bVar11 = *pbVar16;
      if ((char)bVar11 < '\0') {
        if ((bVar11 & 0xe0) == 0xc0) {
LAB_001166ae:
          (parser->buffer).pointer = pbVar16 + 1;
          *local_58[0] = *pbVar16;
          pbVar16 = (parser->buffer).pointer;
          local_58[0] = local_58[0] + 1;
          goto LAB_001166d2;
        }
        if ((bVar11 & 0xf0) == 0xe0) {
LAB_0011668a:
          (parser->buffer).pointer = pbVar16 + 1;
          *local_58[0] = *pbVar16;
          pbVar16 = (parser->buffer).pointer;
          local_58[0] = local_58[0] + 1;
          goto LAB_001166ae;
        }
        if ((bVar11 & 0xf8) == 0xf0) {
          (parser->buffer).pointer = pbVar16 + 1;
          *local_58[0] = *pbVar16;
          pbVar16 = (parser->buffer).pointer;
          local_58[0] = local_58[0] + 1;
          goto LAB_0011668a;
        }
      }
      else {
LAB_001166d2:
        (parser->buffer).pointer = pbVar16 + 1;
        *local_58[0] = *pbVar16;
        local_58[0] = local_58[0] + 1;
      }
      (parser->mark).index = (parser->mark).index + 1;
      psVar2 = &(parser->mark).column;
      *psVar2 = *psVar2 + 1;
      parser->unread = parser->unread - 1;
    }
    local_40 = local_40 + 1;
  } while ((parser->unread != 0) || (iVar12 = yaml_parser_update_buffer(parser,1), iVar12 != 0));
LAB_00116177:
  yaml_free(local_68);
  return 0;
}

Assistant:

static int
yaml_parser_scan_tag_uri(yaml_parser_t *parser, int directive,
        yaml_char_t *head, yaml_mark_t start_mark, yaml_char_t **uri)
{
    size_t length = head ? strlen((char *)head) : 0;
    yaml_string_t string = NULL_STRING;

    if (!STRING_INIT(parser, string, INITIAL_STRING_SIZE)) goto error;

    /* Resize the string to include the head. */

    while ((size_t)(string.end - string.start) <= length) {
        if (!yaml_string_extend(&string.start, &string.pointer, &string.end)) {
            parser->error = YAML_MEMORY_ERROR;
            goto error;
        }
    }

    /*
     * Copy the head if needed.
     *
     * Note that we don't copy the leading '!' character.
     */

    if (length > 1) {
        memcpy(string.start, head+1, length-1);
        string.pointer += length-1;
    }

    /* Scan the tag. */

    if (!CACHE(parser, 1)) goto error;

    /*
     * The set of characters that may appear in URI is as follows:
     *
     *      '0'-'9', 'A'-'Z', 'a'-'z', '_', '-', ';', '/', '?', ':', '@', '&',
     *      '=', '+', '$', ',', '.', '!', '~', '*', '\'', '(', ')', '[', ']',
     *      '%'.
     */

    while (IS_ALPHA(parser->buffer) || CHECK(parser->buffer, ';')
            || CHECK(parser->buffer, '/') || CHECK(parser->buffer, '?')
            || CHECK(parser->buffer, ':') || CHECK(parser->buffer, '@')
            || CHECK(parser->buffer, '&') || CHECK(parser->buffer, '=')
            || CHECK(parser->buffer, '+') || CHECK(parser->buffer, '$')
            || CHECK(parser->buffer, ',') || CHECK(parser->buffer, '.')
            || CHECK(parser->buffer, '!') || CHECK(parser->buffer, '~')
            || CHECK(parser->buffer, '*') || CHECK(parser->buffer, '\'')
            || CHECK(parser->buffer, '(') || CHECK(parser->buffer, ')')
            || CHECK(parser->buffer, '[') || CHECK(parser->buffer, ']')
            || CHECK(parser->buffer, '%'))
    {
        /* Check if it is a URI-escape sequence. */

        if (CHECK(parser->buffer, '%')) {
            if (!STRING_EXTEND(parser, string))
                goto error;

            if (!yaml_parser_scan_uri_escapes(parser,
                        directive, start_mark, &string)) goto error;
        }
        else {
            if (!READ(parser, string)) goto error;
        }

        length ++;
        if (!CACHE(parser, 1)) goto error;
    }

    /* Check if the tag is non-empty. */

    if (!length) {
        if (!STRING_EXTEND(parser, string))
            goto error;

        yaml_parser_set_scanner_error(parser, directive ?
                "while parsing a %TAG directive" : "while parsing a tag",
                start_mark, "did not find expected tag URI");
        goto error;
    }

    *uri = string.start;

    return 1;

error:
    STRING_DEL(parser, string);
    return 0;
}